

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

unsigned_long __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::get_selected(list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *this)

{
  ulong uVar1;
  bool *pbVar2;
  ulong uVar3;
  ulong uVar4;
  auto_mutex M;
  
  M.r = (this->super_scrollable_region).super_drawable.m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  uVar1 = (this->items).array_size;
  uVar3 = 0;
  for (pbVar2 = &((this->items).array_elements)->is_selected;
      (uVar4 = uVar1, uVar3 < uVar1 && (uVar4 = uVar3, *pbVar2 == false)); pbVar2 = pbVar2 + 0x38) {
    uVar3 = uVar3 + 1;
  }
  auto_mutex::~auto_mutex(&M);
  return uVar4;
}

Assistant:

unsigned long list_box<S>::
    get_selected (
    ) const
    {
        auto_mutex M(m);
        DLIB_ASSERT ( multiple_select_enabled() == false,
                "\tunsigned long list_box::get_selected()"
                 );
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            if (items[i].is_selected)
                return i;
        }
        return items.size();
    }